

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_framework.cpp
# Opt level: O1

void __thiscall
PerformanceTestFramework::add(PerformanceTestFramework *this,testFunction test,string *name)

{
  pointer pcVar1;
  undefined1 local_38 [8];
  _Alloc_hider local_30;
  char local_20 [16];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_38 = (undefined1  [8])test;
  local_30._M_p = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_30,pcVar1,pcVar1 + name->_M_string_length);
  std::
  _Rb_tree<std::pair<double,double>(*)(),std::pair<std::pair<double,double>(*const)(),std::__cxx11::string>,std::_Select1st<std::pair<std::pair<double,double>(*const)(),std::__cxx11::string>>,std::less<std::pair<double,double>(*)()>,std::allocator<std::pair<std::pair<double,double>(*const)(),std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::pair<double,double>(*)(),std::__cxx11::string>>
            ((_Rb_tree<std::pair<double,double>(*)(),std::pair<std::pair<double,double>(*const)(),std::__cxx11::string>,std::_Select1st<std::pair<std::pair<double,double>(*const)(),std::__cxx11::string>>,std::less<std::pair<double,double>(*)()>,std::allocator<std::pair<std::pair<double,double>(*const)(),std::__cxx11::string>>>
              *)this,(pair<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_38);
  if (local_30._M_p != local_20) {
    operator_delete(local_30._M_p);
  }
  return;
}

Assistant:

void PerformanceTestFramework::add( const testFunction test, const std::string & name )
{
    _performanceTest.insert( std::pair < testFunction, std::string > ( test, name ) );
}